

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O1

cmMakefile * __thiscall
cmakels::cmake_query::cmake_query::get_makefile(cmake_query *this,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  ulong uVar5;
  int iVar6;
  ulong __n;
  cmMakefile *pcVar7;
  pointer ppcVar8;
  bool bVar9;
  string filename;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> mfs;
  string local_98;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_58;
  pointer local_40;
  
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            (&local_58,
             &((this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
               super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->GlobalGenerator->Makefiles);
  support::uri_to_filename(&local_98,uri);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_40 = local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppcVar8 = local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar7 = (cmMakefile *)0x0;
  }
  else {
    do {
      pcVar7 = *ppcVar8;
      pbVar2 = (pcVar7->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (pbVar2->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + pbVar2->_M_string_length);
      uVar5 = local_70;
      sVar4 = local_98._M_string_length;
      __n = local_98._M_string_length;
      if (local_70 < local_98._M_string_length) {
        __n = local_70;
      }
      if (__n == 0) {
        bVar9 = true;
      }
      else {
        iVar6 = bcmp(local_98._M_dataplus._M_p,local_78,__n);
        bVar9 = iVar6 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((bool)(bVar9 & sVar4 == uVar5)) goto LAB_0013e09e;
      ppcVar8 = ppcVar8 + 1;
    } while (ppcVar8 != local_40);
    pcVar7 = (cmMakefile *)0x0;
  }
LAB_0013e09e:
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar7;
}

Assistant:

cmMakefile *cmake_query::get_makefile(std::string const &uri) {
  auto mfs = my_cmake->GetGlobalGenerator()->GetMakefiles();
  auto filename = normalize_filename(support::uri_to_filename(uri));
  for (auto mf : mfs) {
    if (normalize_filename(mf->GetListFiles()[0]).compare(filename) == 0) {
      return mf;
    }
  }
  return nullptr;
}